

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance.c
# Opt level: O1

void aom_highbd_var_filter_block2d_bil_second_pass
               (uint16_t *src_ptr,uint16_t *output_ptr,uint src_pixels_per_line,uint pixel_step,
               uint output_height,uint output_width,uint8_t *filter)

{
  long lVar1;
  uint uVar2;
  
  if (output_height != 0) {
    uVar2 = 0;
    do {
      if (output_width != 0) {
        lVar1 = 0;
        do {
          *(short *)((long)output_ptr + lVar1) =
               (short)((uint)*filter * (uint)*(ushort *)((long)src_ptr + lVar1) +
                       (uint)filter[1] *
                       (uint)*(ushort *)((long)src_ptr + lVar1 + (ulong)pixel_step * 2) + 0x40 >> 7)
          ;
          lVar1 = lVar1 + 2;
        } while ((ulong)output_width * 2 != lVar1);
        src_ptr = (uint16_t *)((long)src_ptr + lVar1);
      }
      src_ptr = src_ptr + (src_pixels_per_line - output_width);
      uVar2 = uVar2 + 1;
      output_ptr = output_ptr + output_width;
    } while (uVar2 != output_height);
  }
  return;
}

Assistant:

void aom_highbd_var_filter_block2d_bil_second_pass(
    const uint16_t *src_ptr, uint16_t *output_ptr,
    unsigned int src_pixels_per_line, unsigned int pixel_step,
    unsigned int output_height, unsigned int output_width,
    const uint8_t *filter) {
  unsigned int i, j;

  for (i = 0; i < output_height; ++i) {
    for (j = 0; j < output_width; ++j) {
      output_ptr[j] = ROUND_POWER_OF_TWO(
          (int)src_ptr[0] * filter[0] + (int)src_ptr[pixel_step] * filter[1],
          FILTER_BITS);
      ++src_ptr;
    }

    src_ptr += src_pixels_per_line - output_width;
    output_ptr += output_width;
  }
}